

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::added2Set(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *set,
           SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *addset,int n)

{
  int iVar1;
  int iVar2;
  uint n_00;
  int *piVar3;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  char *pcVar5;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int *piVar6;
  int in_ECX;
  int __c;
  ulong extraout_RDX;
  ulong uVar7;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  undefined8 extraout_RDX_01;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *l_xtend;
  int m;
  int k;
  int j_2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec_1;
  int i_3;
  int j_1;
  int i_2;
  int j;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  int i_1;
  int end;
  int tot;
  int i;
  int *more;
  DataArray<int> moreArray;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  DataArray<int> *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff08;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff64;
  uint n_01;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff70;
  int local_88;
  int local_80;
  uint local_7c;
  int local_70;
  int local_68;
  int local_54;
  DataArray<int> local_48;
  int local_2c;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_8;
  
  if (in_ECX != 0) {
    local_2c = in_ECX;
    SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x320d82);
    DataArray<int>::DataArray
              (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
               (int)in_stack_fffffffffffffee8,(Real)in_stack_fffffffffffffee0);
    piVar3 = DataArray<int>::get_ptr(&local_48);
    local_54 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x320dbf);
    while (local_54 = local_54 + -1, -1 < local_54) {
      piVar3[local_54] = 0;
    }
    local_68 = 0;
    iVar1 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x320e45);
    local_70 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x320e63);
    for (local_70 = local_70 - local_2c; iVar2 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
        local_70 < iVar1; local_70 = local_70 + 1) {
      pSVar4 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(pSVar4);
      local_68 = iVar2 + local_68;
      local_7c = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::size(pSVar4);
      uVar7 = extraout_RDX;
      while (local_7c = local_7c - 1, -1 < (int)local_7c) {
        pcVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::index(pSVar4,(char *)(ulong)local_7c,(int)uVar7);
        uVar7 = (ulong)(piVar3[(int)pcVar5] + 1U);
        piVar3[(int)pcVar5] = piVar3[(int)pcVar5] + 1U;
      }
    }
    iVar1 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::memMax((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x320f5f);
    if (iVar1 < local_68) {
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::memRemax(in_stack_ffffffffffffff10,iVar2);
    }
    local_80 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x320f8d);
    while (local_80 = local_80 + -1, -1 < local_80) {
      pSVar4 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      iVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::size(pSVar4);
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::xtend(in_stack_ffffffffffffff70,
              (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
              in_stack_ffffffffffffff64);
      pSVar4 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::set_size(pSVar4,iVar1 + piVar3[local_80]);
      piVar3[local_80] = iVar1;
    }
    local_88 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0x3210a4);
    for (local_88 = local_88 - local_2c;
        iVar1 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)0x3210d4), local_88 < iVar1; local_88 = local_88 + 1) {
      pSVar4 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      n_00 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::size(pSVar4);
      uVar8 = extraout_RDX_00;
      while (n_00 = n_00 - 1, -1 < (int)n_00) {
        pcVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::index(pSVar4,(char *)(ulong)n_00,(int)uVar8);
        n_01 = piVar3[(int)pcVar5];
        piVar3[(int)pcVar5] = n_01 + 1;
        this_00 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::operator[](in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        in_stack_fffffffffffffedc = local_88;
        piVar6 = (int *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::index(this_00,(char *)(ulong)n_01,__c);
        *piVar6 = in_stack_fffffffffffffedc;
        in_stack_fffffffffffffee0 =
             (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::value(pSVar4,n_00);
        local_8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::value(this_00,n_01);
        local_10 = in_stack_fffffffffffffee0;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffee0,
                   (cpp_dec_float<50U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        uVar8 = extraout_RDX_01;
      }
    }
    DataArray<int>::~DataArray((DataArray<int> *)in_stack_fffffffffffffee0);
  }
  return;
}

Assistant:

void added2Set(SVSetBase<R>& set, const SVSetBase<R>& addset, int n)
   {

      if(n == 0)
         return;

      DataArray<int> moreArray(set.num());
      int* more = moreArray.get_ptr();

      for(int i = set.num() - 1; i >= 0; --i)
         more[i] = 0;

      int tot = 0;
      int end = addset.num();

      for(int i = addset.num() - n; i < end; ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         tot += vec.size();

         for(int j = vec.size() - 1; j >= 0; --j)
            more[vec.index(j)]++;
      }

      if(set.memMax() < tot)
         set.memRemax(tot);

      for(int i = set.num() - 1; i >= 0; --i)
      {
         int j = set[i].size();
         set.xtend(set[i], j + more[i]);
         set[i].set_size(j + more[i]);
         more[i] = j;
      }

      for(int i = addset.num() - n; i < addset.num(); ++i)
      {
         const SVectorBase<R>& vec = addset[i];

         for(int j = vec.size() - 1; j >= 0; --j)
         {
            int k = vec.index(j);
            int m = more[k]++;
            SVectorBase<R>& l_xtend = set[k];
            l_xtend.index(m) = i;
            l_xtend.value(m) = vec.value(j);
         }
      }
   }